

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.h
# Opt level: O2

void SpookyHash::ShortEnd(uint64 *h0,uint64 *h1,uint64 *h2,uint64 *h3)

{
  ulong uVar1;
  
  *h3 = *h3 ^ *h2;
  uVar1 = *h2 >> 0x31 | *h2 << 0xf;
  *h2 = uVar1;
  uVar1 = uVar1 + *h3;
  *h3 = uVar1;
  *h0 = *h0 ^ uVar1;
  uVar1 = *h3 >> 0xc | *h3 << 0x34;
  *h3 = uVar1;
  uVar1 = uVar1 + *h0;
  *h0 = uVar1;
  *h1 = *h1 ^ uVar1;
  uVar1 = *h0 >> 0x26 | *h0 << 0x1a;
  *h0 = uVar1;
  uVar1 = uVar1 + *h1;
  *h1 = uVar1;
  *h2 = *h2 ^ uVar1;
  uVar1 = *h1 >> 0xd | *h1 << 0x33;
  *h1 = uVar1;
  uVar1 = uVar1 + *h2;
  *h2 = uVar1;
  *h3 = *h3 ^ uVar1;
  uVar1 = *h2 >> 0x24 | *h2 << 0x1c;
  *h2 = uVar1;
  uVar1 = uVar1 + *h3;
  *h3 = uVar1;
  *h0 = *h0 ^ uVar1;
  uVar1 = *h3 >> 0x37 | *h3 << 9;
  *h3 = uVar1;
  uVar1 = uVar1 + *h0;
  *h0 = uVar1;
  *h1 = *h1 ^ uVar1;
  uVar1 = *h0 >> 0x11 | *h0 << 0x2f;
  *h0 = uVar1;
  uVar1 = uVar1 + *h1;
  *h1 = uVar1;
  *h2 = *h2 ^ uVar1;
  uVar1 = *h1 >> 10 | *h1 << 0x36;
  *h1 = uVar1;
  uVar1 = uVar1 + *h2;
  *h2 = uVar1;
  *h3 = *h3 ^ uVar1;
  uVar1 = *h2 >> 0x20 | *h2 << 0x20;
  *h2 = uVar1;
  uVar1 = uVar1 + *h3;
  *h3 = uVar1;
  *h0 = *h0 ^ uVar1;
  uVar1 = *h3 >> 0x27 | *h3 << 0x19;
  *h3 = uVar1;
  uVar1 = uVar1 + *h0;
  *h0 = uVar1;
  *h1 = *h1 ^ uVar1;
  uVar1 = *h0 >> 1 | *h0 << 0x3f;
  *h0 = uVar1;
  *h1 = *h1 + uVar1;
  return;
}

Assistant:

static INLINE void ShortEnd(uint64 &h0, uint64 &h1, uint64 &h2, uint64 &h3)
    {
        h3 ^= h2;  h2 = Rot64(h2,15);  h3 += h2;
        h0 ^= h3;  h3 = Rot64(h3,52);  h0 += h3;
        h1 ^= h0;  h0 = Rot64(h0,26);  h1 += h0;
        h2 ^= h1;  h1 = Rot64(h1,51);  h2 += h1;
        h3 ^= h2;  h2 = Rot64(h2,28);  h3 += h2;
        h0 ^= h3;  h3 = Rot64(h3,9);   h0 += h3;
        h1 ^= h0;  h0 = Rot64(h0,47);  h1 += h0;
        h2 ^= h1;  h1 = Rot64(h1,54);  h2 += h1;
        h3 ^= h2;  h2 = Rot64(h2,32);  h3 += h2;
        h0 ^= h3;  h3 = Rot64(h3,25);  h0 += h3;
        h1 ^= h0;  h0 = Rot64(h0,63);  h1 += h0;
    }